

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1908.c
# Opt level: O0

int test(char *URL)

{
  long lVar1;
  timeval tVar2;
  __time_t local_30;
  __suseconds_t local_28;
  CURL *hnd;
  CURLcode ret;
  char *URL_local;
  
  hnd._4_4_ = 0;
  tVar2 = tutil_tvnow();
  local_30 = tVar2.tv_sec;
  tv_test_start.tv_sec = local_30;
  local_28 = tVar2.tv_usec;
  tv_test_start.tv_usec = local_28;
  curl_global_init(3);
  lVar1 = curl_easy_init();
  if (lVar1 != 0) {
    curl_easy_setopt(lVar1,0x2712,URL);
    curl_easy_setopt(lVar1,0x2b,1);
    curl_easy_setopt(lVar1,0x282f,"log/altsvc-1908");
    hnd._4_4_ = curl_easy_perform(lVar1);
    curl_easy_reset(lVar1);
    curl_easy_cleanup(lVar1);
  }
  curl_global_cleanup();
  return hnd._4_4_;
}

Assistant:

int test(char *URL)
{
  CURLcode ret = CURLE_OK;
  CURL *hnd;
  start_test_timing();

  curl_global_init(CURL_GLOBAL_ALL);

  hnd = curl_easy_init();
  if(hnd) {
    curl_easy_setopt(hnd, CURLOPT_URL, URL);
    curl_easy_setopt(hnd, CURLOPT_NOPROGRESS, 1L);
    curl_easy_setopt(hnd, CURLOPT_ALTSVC, "log/altsvc-1908");
    ret = curl_easy_perform(hnd);
    curl_easy_reset(hnd);
    curl_easy_cleanup(hnd);
  }
  curl_global_cleanup();
  return (int)ret;
}